

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_dir.c
# Opt level: O3

void print_entry(ALLEGRO_FS_ENTRY *entry)

{
  char cVar1;
  ulong uVar2;
  ALLEGRO_FS_ENTRY *entry_00;
  undefined8 uVar3;
  
  print_file(entry);
  uVar2 = al_get_fs_entry_mode(entry);
  if ((uVar2 & 0x20) == 0) {
    return;
  }
  cVar1 = al_open_directory(entry);
  if (cVar1 != '\0') {
    entry_00 = (ALLEGRO_FS_ENTRY *)al_read_directory(entry);
    while (entry_00 != (ALLEGRO_FS_ENTRY *)0x0) {
      print_entry(entry_00);
      al_destroy_fs_entry(entry_00);
      entry_00 = (ALLEGRO_FS_ENTRY *)al_read_directory(entry);
    }
    al_close_directory(entry);
    return;
  }
  uVar3 = al_get_fs_entry_name(entry);
  log_printf("Error opening directory: %s\n",uVar3);
  return;
}

Assistant:

static void print_entry(ALLEGRO_FS_ENTRY *entry)
{
   ALLEGRO_FS_ENTRY *next;

   print_file(entry);

   if (!(al_get_fs_entry_mode(entry) & ALLEGRO_FILEMODE_ISDIR))
      return;

   if (!al_open_directory(entry)) {
      log_printf("Error opening directory: %s\n", al_get_fs_entry_name(entry));
      return;
   }

   while (1) {
      next = al_read_directory(entry);
      if (!next)
         break;

      print_entry(next);
      al_destroy_fs_entry(next);
   }

   al_close_directory(entry);
}